

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void dgrminer::printResultsToFiles
               (results_crate *results,results_crate_anomalies *results_anomalies,PartialUnion *pu,
               string *output_file,bool set_of_graphs,bool compute_confidence,
               bool search_for_anomalies,bool append_to_file)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718 [36];
  int local_6f4;
  ulong uStack_6f0;
  int j_5;
  size_t i_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8 [32];
  ulong local_6a8;
  size_t i_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680 [32];
  ulong local_660;
  size_t i_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638 [36];
  int local_614;
  ulong uStack_610;
  int j_4;
  size_t i_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8 [36];
  int local_5c4;
  ulong uStack_5c0;
  int j_3;
  size_t i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [32];
  string local_578 [8];
  ofstream myfile_1;
  int local_374;
  ulong uStack_370;
  int j_2;
  size_t i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  ulong local_328;
  size_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [36];
  int local_2dc;
  ulong uStack_2d8;
  int j_1;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [36];
  int local_28c;
  ulong uStack_288;
  int j;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  string local_230 [8];
  ofstream myfile;
  bool append_to_file_local;
  bool search_for_anomalies_local;
  bool compute_confidence_local;
  bool set_of_graphs_local;
  string *output_file_local;
  PartialUnion *pu_local;
  results_crate_anomalies *results_anomalies_local;
  results_crate *results_local;
  
  std::ofstream::ofstream(local_230);
  if (append_to_file) {
    std::operator+(local_250,(char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)local_250);
    std::__cxx11::string::~string((string *)local_250);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                   (char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)&i);
    std::__cxx11::string::~string((string *)&i);
    poVar7 = std::operator<<((ostream *)local_230,"pattern,id,label_int,changetime");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  for (uStack_288 = 0; uVar11 = uStack_288,
      sVar1 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::size
                        (&results->result_nodes), uVar11 < sVar1; uStack_288 = uStack_288 + 1) {
    for (local_28c = 0; local_28c < 4; local_28c = local_28c + 1) {
      pvVar2 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::operator[]
                         (&results->result_nodes,uStack_288);
      pvVar3 = std::array<int,_4UL>::operator[](pvVar2,(long)local_28c);
      std::ostream::operator<<((ostream *)local_230,*pvVar3);
      if (local_28c < 3) {
        std::operator<<((ostream *)local_230,",");
      }
    }
    std::ostream::operator<<((ostream *)local_230,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  if (append_to_file) {
    std::operator+(local_2b0,(char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)local_2b0);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                   (char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    poVar7 = std::operator<<((ostream *)local_230,"pattern,src,dst,label_int,direction,edgetime");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  for (uStack_2d8 = 0; uVar11 = uStack_2d8,
      sVar1 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                        (&results->result_edges), uVar11 < sVar1; uStack_2d8 = uStack_2d8 + 1) {
    for (local_2dc = 0; local_2dc < 6; local_2dc = local_2dc + 1) {
      pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator[]
                         (&results->result_edges,uStack_2d8);
      pvVar5 = std::array<int,_6UL>::operator[](pvVar4,(long)local_2dc);
      std::ostream::operator<<((ostream *)local_230,*pvVar5);
      if (local_2dc < 5) {
        std::operator<<((ostream *)local_230,",");
      }
    }
    std::ostream::operator<<((ostream *)local_230,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  if (append_to_file) {
    std::operator+(local_300,(char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)local_300);
    std::__cxx11::string::~string((string *)local_300);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2,
                   (char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)&i_2);
    std::__cxx11::string::~string((string *)&i_2);
    std::operator<<((ostream *)local_230,"support_absolute,support_relative");
    if (compute_confidence) {
      std::operator<<((ostream *)local_230,",confidence");
    }
    std::ostream::operator<<((ostream *)local_230,std::endl<char,std::char_traits<char>>);
  }
  for (local_328 = 0; uVar11 = local_328,
      sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&results->support_absolute), uVar11 < sVar1; local_328 = local_328 + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&results->support_absolute,local_328);
    std::ostream::operator<<((ostream *)local_230,*pvVar6);
    poVar7 = std::operator<<((ostream *)local_230,",");
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&results->support,local_328);
    std::ostream::operator<<(poVar7,*pvVar8);
    if (compute_confidence) {
      poVar7 = std::operator<<((ostream *)local_230,",");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&results->confidence,local_328);
      std::ostream::operator<<(poVar7,*pvVar8);
    }
    std::ostream::operator<<((ostream *)local_230,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  if (append_to_file) {
    std::operator+(local_348,(char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)local_348);
    std::__cxx11::string::~string((string *)local_348);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_3,
                   (char *)output_file);
    std::ofstream::open(local_230,(_Ios_Openmode)&i_3);
    std::__cxx11::string::~string((string *)&i_3);
    if (set_of_graphs) {
      poVar7 = std::operator<<((ostream *)local_230,"graphs");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = std::operator<<((ostream *)local_230,"graph_snapshots");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  for (uStack_370 = 0;
      sVar1 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&results->occurrences), uStack_370 < sVar1; uStack_370 = uStack_370 + 1) {
    local_374 = 0;
    while( true ) {
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&results->occurrences,uStack_370);
      sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar9);
      if (sVar1 <= (ulong)(long)local_374) break;
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&results->occurrences,uStack_370);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(long)local_374);
      std::ostream::operator<<((ostream *)local_230,*pvVar10 + 1);
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&results->occurrences,uStack_370);
      sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar9);
      if ((ulong)(long)local_374 < sVar1 - 1) {
        std::operator<<((ostream *)local_230,",");
      }
      local_374 = local_374 + 1;
    }
    std::ostream::operator<<((ostream *)local_230,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  if (search_for_anomalies) {
    std::ofstream::ofstream(local_578);
    if (append_to_file) {
      std::operator+(local_598,(char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)local_598);
      std::__cxx11::string::~string((string *)local_598);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_4,
                     (char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)&i_4);
      std::__cxx11::string::~string((string *)&i_4);
      poVar7 = std::operator<<((ostream *)local_578,"anomaly_pattern,id,label_int,changetime");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    for (uStack_5c0 = 0; uVar11 = uStack_5c0,
        sVar1 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::size
                          (&results_anomalies->anomaly_result_nodes), uVar11 < sVar1;
        uStack_5c0 = uStack_5c0 + 1) {
      for (local_5c4 = 0; local_5c4 < 4; local_5c4 = local_5c4 + 1) {
        pvVar2 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                 operator[](&results_anomalies->anomaly_result_nodes,uStack_5c0);
        pvVar3 = std::array<int,_4UL>::operator[](pvVar2,(long)local_5c4);
        std::ostream::operator<<((ostream *)local_578,*pvVar3);
        if (local_5c4 < 3) {
          std::operator<<((ostream *)local_578,",");
        }
      }
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(local_5e8,(char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)local_5e8);
      std::__cxx11::string::~string((string *)local_5e8);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5,
                     (char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)&i_5);
      std::__cxx11::string::~string((string *)&i_5);
      poVar7 = std::operator<<((ostream *)local_578,
                               "anomaly_pattern,src,dst,label_int,direction,edgetime");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    for (uStack_610 = 0; uVar11 = uStack_610,
        sVar1 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                          (&results_anomalies->anomaly_result_edges), uVar11 < sVar1;
        uStack_610 = uStack_610 + 1) {
      for (local_614 = 0; local_614 < 6; local_614 = local_614 + 1) {
        pvVar4 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::
                 operator[](&results_anomalies->anomaly_result_edges,uStack_610);
        pvVar5 = std::array<int,_6UL>::operator[](pvVar4,(long)local_614);
        std::ostream::operator<<((ostream *)local_578,*pvVar5);
        if (local_614 < 5) {
          std::operator<<((ostream *)local_578,",");
        }
      }
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(local_638,(char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)local_638);
      std::__cxx11::string::~string((string *)local_638);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_6,
                     (char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)&i_6);
      std::__cxx11::string::~string((string *)&i_6);
      std::operator<<((ostream *)local_578,"anomaly_pattern,pattern");
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    for (local_660 = 0; uVar11 = local_660,
        sVar1 = std::vector<int,_std::allocator<int>_>::size
                          (&results_anomalies->anomaly_id_of_anomalous_pattern), uVar11 < sVar1;
        local_660 = local_660 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&results_anomalies->anomaly_id_of_anomalous_pattern,local_660);
      std::ostream::operator<<((ostream *)local_578,*pvVar10);
      poVar7 = std::operator<<((ostream *)local_578,",");
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&results_anomalies->anomaly_id_of_explanation_pattern,local_660);
      std::ostream::operator<<(poVar7,*pvVar10);
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(local_680,(char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)local_680);
      std::__cxx11::string::~string((string *)local_680);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_7,
                     (char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)&i_7);
      std::__cxx11::string::~string((string *)&i_7);
      std::operator<<((ostream *)local_578,"outlierness");
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    for (local_6a8 = 0; uVar11 = local_6a8,
        sVar1 = std::vector<double,_std::allocator<double>_>::size
                          (&results_anomalies->anomaly_outlierness), uVar11 < sVar1;
        local_6a8 = local_6a8 + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&results_anomalies->anomaly_outlierness,local_6a8);
      std::ostream::operator<<((ostream *)local_578,*pvVar8);
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    if (append_to_file) {
      std::operator+(local_6c8,(char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)local_6c8);
      std::__cxx11::string::~string((string *)local_6c8);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_8,
                     (char *)output_file);
      std::ofstream::open(local_578,(_Ios_Openmode)&i_8);
      std::__cxx11::string::~string((string *)&i_8);
      if (set_of_graphs) {
        poVar7 = std::operator<<((ostream *)local_578,"graphs");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar7 = std::operator<<((ostream *)local_578,"graph_snapshots");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
    }
    for (uStack_6f0 = 0; uVar11 = uStack_6f0,
        sVar1 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::size(&results_anomalies->anomaly_occurrences), uVar11 < sVar1;
        uStack_6f0 = uStack_6f0 + 1) {
      local_6f4 = 0;
      while( true ) {
        uVar11 = (ulong)local_6f4;
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&results_anomalies->anomaly_occurrences,uStack_6f0);
        sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar9);
        if (sVar1 <= uVar11) break;
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&results_anomalies->anomaly_occurrences,uStack_6f0);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(long)local_6f4);
        std::ostream::operator<<((ostream *)local_578,*pvVar10 + 1);
        uVar11 = (ulong)local_6f4;
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&results_anomalies->anomaly_occurrences,uStack_6f0);
        sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar9);
        if (uVar11 < sVar1 - 1) {
          std::operator<<((ostream *)local_578,",");
        }
        local_6f4 = local_6f4 + 1;
      }
      std::ostream::operator<<((ostream *)local_578,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_578);
  }
  if (!append_to_file) {
    std::operator+(local_718,(char *)output_file);
    PartialUnion::outputEncodingToFile(pu,local_718);
    std::__cxx11::string::~string((string *)local_718);
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::clear
            (&results->result_nodes);
  std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::clear
            (&results->result_edges);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&results->support_absolute);
  std::vector<double,_std::allocator<double>_>::clear(&results->support);
  std::vector<double,_std::allocator<double>_>::clear(&results->confidence);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&results->occurrences);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&results->occurrences_antecedent);
  if (search_for_anomalies) {
    std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::clear
              (&results_anomalies->anomaly_result_nodes);
    std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::clear
              (&results_anomalies->anomaly_result_edges);
    std::vector<int,_std::allocator<int>_>::clear
              (&results_anomalies->anomaly_id_of_anomalous_pattern);
    std::vector<int,_std::allocator<int>_>::clear
              (&results_anomalies->anomaly_id_of_explanation_pattern);
    std::vector<double,_std::allocator<double>_>::clear(&results_anomalies->anomaly_outlierness);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&results_anomalies->anomaly_occurrences);
  }
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void printResultsToFiles(results_crate * results, results_crate_anomalies * results_anomalies, PartialUnion pu, std::string output_file, bool set_of_graphs,
		bool compute_confidence, bool search_for_anomalies, bool append_to_file)
	{
		// NODES
		ofstream myfile;
		if (append_to_file) {
			myfile.open(output_file + "_nodes", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_nodes");
			myfile << "pattern,id,label_int,changetime" << endl;
		}
		for (size_t i = 0; i < results->result_nodes.size(); i++)
		{
			for (int j = 0; j < 4; j++)
			{
				myfile << results->result_nodes[i][j];
				if (j < 3) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// EDGES
		if (append_to_file) {
			myfile.open(output_file + "_edges", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_edges");
			myfile << "pattern,src,dst,label_int,direction,edgetime" << endl;
		}
		for (size_t i = 0; i < results->result_edges.size(); i++)
		{
			for (int j = 0; j < 6; j++)
			{
				myfile << results->result_edges[i][j];
				if (j < 5) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// MEASURES
		if (append_to_file) {
			myfile.open(output_file + "_measures", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_measures");
			myfile << "support_absolute,support_relative";
			if (compute_confidence)
			{
				myfile << ",confidence";
			}
			myfile << endl;
		}
		for (size_t i = 0; i < results->support_absolute.size(); i++)
		{
			myfile << results->support_absolute[i];
			myfile << "," << results->support[i];
			if (compute_confidence)
			{
				myfile << "," << results->confidence[i];
			}
			myfile << endl;
		}
		myfile.close();

		// index snapshots from 1

		// OCCURRENCES
		if (append_to_file) {
			myfile.open(output_file + "_occurrences", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_occurrences");
			if (set_of_graphs)
			{
				myfile << "graphs" << endl;
			}
			else
			{
				myfile << "graph_snapshots" << endl;
			}
		}
		for (size_t i = 0; i < results->occurrences.size(); i++)
		{

			for (int j = 0; j < results->occurrences[i].size(); j++)
			{
				myfile << (results->occurrences[i][j] + 1);
				if (j < results->occurrences[i].size() - 1) {
					myfile << ",";
				}
			}

			myfile << endl;
		}
		myfile.close();



		// print anomalies:
		if (search_for_anomalies)
		{
			// NODES
			ofstream myfile;
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_nodes", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_nodes");
				myfile << "anomaly_pattern,id,label_int,changetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_nodes.size(); i++)
			{
				for (int j = 0; j < 4; j++)
				{
					myfile << results_anomalies->anomaly_result_nodes[i][j];
					if (j < 3) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// EDGES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_edges", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_edges");
				myfile << "anomaly_pattern,src,dst,label_int,direction,edgetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_edges.size(); i++)
			{
				for (int j = 0; j < 6; j++)
				{
					myfile << results_anomalies->anomaly_result_edges[i][j];
					if (j < 5) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// LINKING TO FREQUENT PATTERNS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_explanation", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_explanation");
				myfile << "anomaly_pattern,pattern";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_id_of_anomalous_pattern.size(); i++)
			{
				myfile << results_anomalies->anomaly_id_of_anomalous_pattern[i];
				myfile << "," << results_anomalies->anomaly_id_of_explanation_pattern[i];
				myfile << endl;
			}
			myfile.close();

			// ANOMALY OUTLIERNESS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_outlierness", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_outlierness");
				myfile << "outlierness";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_outlierness.size(); i++)
			{
				myfile << results_anomalies->anomaly_outlierness[i];
				myfile << endl;
			}
			myfile.close();

			// index snapshots from 1

			// OCCURRENCES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_occurrences", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_occurrences");
				if (set_of_graphs)
				{
					myfile << "graphs" << endl;
				}
				else
				{
					myfile << "graph_snapshots" << endl;
				}
			}
			for (size_t i = 0; i < results_anomalies->anomaly_occurrences.size(); i++)
			{

				for (int j = 0; j < results_anomalies->anomaly_occurrences[i].size(); j++)
				{
					myfile << (results_anomalies->anomaly_occurrences[i][j] + 1);
					if (j < results_anomalies->anomaly_occurrences[i].size() - 1) {
						myfile << ",";
					}
				}

				myfile << endl;
			}
			myfile.close();
		}

		if (!append_to_file) {
			pu.outputEncodingToFile(output_file + "_encoding");
		}

		results->result_nodes.clear();
		results->result_edges.clear();
		results->support_absolute.clear();
		results->support.clear();
		results->confidence.clear();
		results->occurrences.clear();
		results->occurrences_antecedent.clear();

		if (search_for_anomalies)
		{
			results_anomalies->anomaly_result_nodes.clear();
			results_anomalies->anomaly_result_edges.clear();
			results_anomalies->anomaly_id_of_anomalous_pattern.clear();
			results_anomalies->anomaly_id_of_explanation_pattern.clear();
			results_anomalies->anomaly_outlierness.clear();
			results_anomalies->anomaly_occurrences.clear();
		}
	}